

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::SimplePFor<FastPForLib::Simple8b<true>_>::SimplePFor
          (SimplePFor<FastPForLib::Simple8b<true>_> *this,uint32_t ps)

{
  uint32_t uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  undefined4 in_ESI;
  IntegerCODEC *in_RDI;
  Simple8b<true> *in_stack_ffffffffffffffa0;
  allocator_type *in_stack_ffffffffffffffb0;
  allocator_type *__a;
  IntegerCODEC *__n;
  allocator_type local_1e [18];
  undefined4 local_c;
  
  local_c = in_ESI;
  IntegerCODEC::IntegerCODEC(in_RDI);
  in_RDI->_vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_00480c48;
  Simple8b<true>::Simple8b(in_stack_ffffffffffffffa0);
  *(undefined4 *)&in_RDI[2]._vptr_IntegerCODEC = local_c;
  uVar1 = gccbits(*(uint32_t *)&in_RDI[2]._vptr_IntegerCODEC);
  *(uint32_t *)((long)&in_RDI[2]._vptr_IntegerCODEC + 4) = uVar1;
  __n = in_RDI + 3;
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            (ulong)*(uint *)&in_RDI[2]._vptr_IntegerCODEC;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x146b70);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(size_type)__n,
             in_stack_ffffffffffffffb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x146b90);
  __a = local_1e;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x146bc2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00,(size_type)__n,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x146be2);
  return;
}

Assistant:

SimplePFor(uint32_t ps = 65536)
      : ecoder(), PageSize(ps), bitsPageSize(gccbits(PageSize)),
        datatobepacked(PageSize),
        bytescontainer(PageSize + 3 * PageSize / BlockSize) {
    assert(ps / BlockSize * BlockSize == ps);
    assert(gccbits(static_cast<uint32_t>(BlockSizeInUnitsOfPackSize * PACKSIZE - 1)) <= 8);
  }